

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

Value * __thiscall Json::Value::operator=(Value *this,Value *other)

{
  ValueHolder VVar1;
  ushort uVar2;
  Value temp;
  ValueHolder local_20;
  ushort local_18;
  
  Value((Value *)&local_20,other);
  VVar1 = this->value_;
  this->value_ = local_20;
  uVar2 = *(ushort *)&this->field_0x8;
  *(ushort *)&this->field_0x8 = uVar2 & 0xff00 | local_18 & 0xff;
  *(ushort *)&this->field_0x8 = uVar2 & 0xfe00 | local_18 & 0xff | local_18 & 0x100;
  local_18 = local_18 & 0xfe00 | uVar2 & 0xff | uVar2 & 0x100;
  local_20 = VVar1;
  ~Value((Value *)&local_20);
  return this;
}

Assistant:

Value&
Value::operator= ( const Value& other )
{
    Value temp ( other );
    swap ( temp );
    return *this;
}